

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O3

void __thiscall
cbtHashMap<cbtHashString,_cbtCollisionObject_*>::insert
          (cbtHashMap<cbtHashString,_cbtCollisionObject_*> *this,cbtHashString *key,
          cbtCollisionObject **value)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  cbtCollisionObject **ptr;
  cbtHashString *pcVar4;
  pointer pcVar5;
  int *piVar6;
  string *psVar7;
  int iVar8;
  uint uVar9;
  cbtCollisionObject **ppcVar10;
  ulong uVar11;
  uint uVar12;
  int _Count;
  int sz;
  
  uVar12 = key->m_hash;
  iVar1 = (this->m_valueArray).m_capacity;
  iVar8 = findIndex(this,key);
  if (iVar8 == -1) {
    uVar2 = (this->m_valueArray).m_size;
    uVar3 = (this->m_valueArray).m_capacity;
    uVar9 = uVar2;
    if (uVar2 == uVar3) {
      iVar8 = 1;
      if (uVar2 != 0) {
        iVar8 = uVar2 * 2;
      }
      if ((int)uVar2 < iVar8) {
        if (iVar8 == 0) {
          ppcVar10 = (cbtCollisionObject **)0x0;
        }
        else {
          ppcVar10 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar8 << 3,0x10);
          uVar9 = (this->m_valueArray).m_size;
        }
        if (0 < (int)uVar9) {
          uVar11 = 0;
          do {
            ppcVar10[uVar11] = (this->m_valueArray).m_data[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        ptr = (this->m_valueArray).m_data;
        if ((ptr != (cbtCollisionObject **)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr);
          uVar9 = (this->m_valueArray).m_size;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppcVar10;
        (this->m_valueArray).m_capacity = iVar8;
      }
    }
    (this->m_valueArray).m_data[(int)uVar9] = *value;
    (this->m_valueArray).m_size = uVar9 + 1;
    iVar8 = (this->m_keyArray).m_size;
    if (iVar8 == (this->m_keyArray).m_capacity) {
      _Count = 1;
      if (iVar8 != 0) {
        _Count = iVar8 * 2;
      }
      cbtAlignedObjectArray<cbtHashString>::reserve(&this->m_keyArray,_Count);
      iVar8 = (this->m_keyArray).m_size;
    }
    pcVar4 = (this->m_keyArray).m_data;
    psVar7 = &pcVar4[iVar8].m_string1;
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    pcVar5 = (key->m_string1)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar4 + iVar8),pcVar5,pcVar5 + (key->m_string1)._M_string_length);
    *(uint *)(psVar7 + 1) = key->m_hash;
    piVar6 = &(this->m_keyArray).m_size;
    *piVar6 = *piVar6 + 1;
    if ((int)uVar3 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar12 = (this->m_valueArray).m_capacity - 1U & key->m_hash;
    }
    else {
      uVar12 = iVar1 - 1U & uVar12;
    }
    piVar6 = (this->m_hashTable).m_data;
    (this->m_next).m_data[(int)uVar2] = piVar6[(int)uVar12];
    piVar6[(int)uVar12] = uVar2;
  }
  else {
    (this->m_valueArray).m_data[iVar8] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}